

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

uint32 * __thiscall google::protobuf::Reflection::MutableHasBits(Reflection *this,Message *message)

{
  uint32 offset;
  uint *puVar1;
  Message *in_RSI;
  ReflectionSchema *in_stack_ffffffffffffffe0;
  
  offset = internal::ReflectionSchema::HasBitsOffset(in_stack_ffffffffffffffe0);
  puVar1 = anon_unknown_0::GetPointerAtOffset<unsigned_int>(in_RSI,offset);
  return puVar1;
}

Assistant:

uint32* Reflection::MutableHasBits(Message* message) const {
  GOOGLE_DCHECK(schema_.HasHasbits());
  return GetPointerAtOffset<uint32>(message, schema_.HasBitsOffset());
}